

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::FixStorageClass::WalkAccessChainType
          (FixStorageClass *this,Instruction *inst,uint32_t id)

{
  Op OVar1;
  StorageClass storage_class;
  uint32_t uVar2;
  StorageClass SVar3;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  IRContext *pIVar6;
  ConstantManager *this_00;
  Constant *this_01;
  int64_t iVar7;
  TypeManager *this_02;
  StorageClass orig_storage_class;
  Instruction *orig_type_inst;
  uint32_t index;
  Constant *index_const;
  Instruction *type_inst;
  uint32_t i;
  StorageClass input_storage_class;
  Instruction *id_type_inst;
  uint32_t start_idx;
  uint32_t id_local;
  Instruction *inst_local;
  FixStorageClass *this_local;
  
  OVar1 = opt::Instruction::opcode(inst);
  if (OVar1 - OpAccessChain < 2) {
    id_type_inst._0_4_ = 1;
  }
  else {
    if ((OVar1 != OpPtrAccessChain) && (OVar1 != OpInBoundsPtrAccessChain)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                    ,0x136,
                    "uint32_t spvtools::opt::FixStorageClass::WalkAccessChainType(Instruction *, uint32_t)"
                   );
    }
    id_type_inst._0_4_ = 2;
  }
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar5 = analysis::DefUseManager::GetDef(pDVar4,id);
  OVar1 = opt::Instruction::opcode(pIVar5);
  if (OVar1 != OpTypePointer) {
    __assert_fail("id_type_inst->opcode() == spv::Op::OpTypePointer",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                  ,0x13b,
                  "uint32_t spvtools::opt::FixStorageClass::WalkAccessChainType(Instruction *, uint32_t)"
                 );
  }
  id_type_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(pIVar5,1);
  storage_class = opt::Instruction::GetSingleWordInOperand(pIVar5,0);
  type_inst._0_4_ = (uint)id_type_inst;
  do {
    uVar2 = opt::Instruction::NumInOperands(inst);
    if (uVar2 <= (uint)type_inst) {
      pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
      uVar2 = opt::Instruction::type_id(inst);
      pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
      SVar3 = opt::Instruction::GetSingleWordInOperand(pIVar5,0);
      OVar1 = opt::Instruction::opcode(pIVar5);
      if (OVar1 == OpTypePointer) {
        uVar2 = opt::Instruction::GetSingleWordInOperand(pIVar5,1);
        if ((uVar2 == id_type_inst._4_4_) && (storage_class == SVar3)) {
          this_local._4_4_ = opt::Instruction::type_id(inst);
        }
        else {
          pIVar6 = Pass::context(&this->super_Pass);
          this_02 = IRContext::get_type_mgr(pIVar6);
          this_local._4_4_ =
               analysis::TypeManager::FindPointerToType(this_02,id_type_inst._4_4_,storage_class);
        }
        return this_local._4_4_;
      }
      __assert_fail("orig_type_inst->opcode() == spv::Op::OpTypePointer",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                    ,0x163,
                    "uint32_t spvtools::opt::FixStorageClass::WalkAccessChainType(Instruction *, uint32_t)"
                   );
    }
    pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
    pIVar5 = analysis::DefUseManager::GetDef(pDVar4,id_type_inst._4_4_);
    OVar1 = opt::Instruction::opcode(pIVar5);
    if ((OVar1 - OpTypeVector < 2) || (OVar1 - OpTypeArray < 2)) {
LAB_009bfa6d:
      id_type_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(pIVar5,0);
    }
    else if (OVar1 == OpTypeStruct) {
      pIVar6 = Pass::context(&this->super_Pass);
      this_00 = IRContext::get_constant_mgr(pIVar6);
      uVar2 = opt::Instruction::GetSingleWordInOperand(inst,(uint)type_inst);
      this_01 = analysis::ConstantManager::FindDeclaredConstant(this_00,uVar2);
      iVar7 = analysis::Constant::GetSignExtendedValue(this_01);
      id_type_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(pIVar5,(uint32_t)iVar7);
    }
    else if ((OVar1 == OpTypeCooperativeMatrixKHR) || (OVar1 == OpTypeNodePayloadArrayAMDX))
    goto LAB_009bfa6d;
    if (id_type_inst._4_4_ == 0) {
      __assert_fail("id != 0 && \"Tried to extract from an object where it cannot be done.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                    ,0x15d,
                    "uint32_t spvtools::opt::FixStorageClass::WalkAccessChainType(Instruction *, uint32_t)"
                   );
    }
    type_inst._0_4_ = (uint)type_inst + 1;
  } while( true );
}

Assistant:

uint32_t FixStorageClass::WalkAccessChainType(Instruction* inst, uint32_t id) {
  uint32_t start_idx = 0;
  switch (inst->opcode()) {
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
      start_idx = 1;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
      start_idx = 2;
      break;
    default:
      assert(false);
      break;
  }

  Instruction* id_type_inst = get_def_use_mgr()->GetDef(id);
  assert(id_type_inst->opcode() == spv::Op::OpTypePointer);
  id = id_type_inst->GetSingleWordInOperand(1);
  spv::StorageClass input_storage_class =
      static_cast<spv::StorageClass>(id_type_inst->GetSingleWordInOperand(0));

  for (uint32_t i = start_idx; i < inst->NumInOperands(); ++i) {
    Instruction* type_inst = get_def_use_mgr()->GetDef(id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeNodePayloadArrayAMDX:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeCooperativeMatrixKHR:
        id = type_inst->GetSingleWordInOperand(0);
        break;
      case spv::Op::OpTypeStruct: {
        const analysis::Constant* index_const =
            context()->get_constant_mgr()->FindDeclaredConstant(
                inst->GetSingleWordInOperand(i));
        // It is highly unlikely that any type would have more fields than could
        // be indexed by a 32-bit integer, and GetSingleWordInOperand only takes
        // a 32-bit value, so we would not be able to handle it anyway. But the
        // specification does allow any scalar integer type, treated as signed,
        // so we simply downcast the index to 32-bits.
        uint32_t index =
            static_cast<uint32_t>(index_const->GetSignExtendedValue());
        id = type_inst->GetSingleWordInOperand(index);
        break;
      }
      default:
        break;
    }
    assert(id != 0 &&
           "Tried to extract from an object where it cannot be done.");
  }

  Instruction* orig_type_inst = get_def_use_mgr()->GetDef(inst->type_id());
  spv::StorageClass orig_storage_class =
      static_cast<spv::StorageClass>(orig_type_inst->GetSingleWordInOperand(0));
  assert(orig_type_inst->opcode() == spv::Op::OpTypePointer);
  if (orig_type_inst->GetSingleWordInOperand(1) == id &&
      input_storage_class == orig_storage_class) {
    // The existing type is correct. Avoid the search for the type. Note that if
    // there is a duplicate type, the search below could return a different type
    // forcing more changes to the code than necessary.
    return inst->type_id();
  }

  return context()->get_type_mgr()->FindPointerToType(id, input_storage_class);
}